

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumber
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  int iVar1;
  bool bVar2;
  EnumValueDescriptor *pEVar3;
  reference ppEVar4;
  const_iterator it;
  iterator local_40;
  iterator local_30;
  
  pEVar3 = EnumDescriptor::value(parent,0);
  iVar1 = pEVar3->number_;
  if ((iVar1 <= number) && ((long)number <= (long)parent->sequential_value_limit_ + (long)iVar1)) {
    pEVar3 = EnumDescriptor::value(parent,number - iVar1);
    return pEVar3;
  }
  local_40.ctrl_ = (ctrl_t *)parent;
  local_40.field_1._0_4_ = number;
  local_30 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                       (&(this->enum_values_by_number_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        ,(key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)
                         &local_40);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&(this->enum_values_by_number_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            );
  local_40.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20250127::container_internal::operator==(&local_30,&local_40);
  if (bVar2) {
    pEVar3 = (EnumValueDescriptor *)0x0;
  }
  else {
    ppEVar4 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::iterator::operator*(&local_30);
    pEVar3 = *ppEVar4;
  }
  return pEVar3;
}

Assistant:

inline const EnumValueDescriptor* FileDescriptorTables::FindEnumValueByNumber(
    const EnumDescriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  const int base = parent->value(0)->number();
  if (base <= number &&
      number <= static_cast<int64_t>(base) + parent->sequential_value_limit_) {
    return parent->value(number - base);
  }

  auto it = enum_values_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == enum_values_by_number_.end() ? nullptr : *it;
}